

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

void vli_mult(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  uECC_word_t *puVar8;
  uECC_word_t uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uECC_word_t uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong *puVar17;
  bool bVar18;
  
  uVar11 = 0;
  uVar13 = 0;
  uVar10 = 0;
  do {
    uVar9 = uVar10;
    uVar10 = 0;
    puVar8 = left;
    uVar16 = uVar11;
    do {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = right[uVar16 & 0xffffffff];
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *puVar8;
      uVar7 = SUB168(auVar2 * auVar4,8);
      uVar6 = SUB168(auVar2 * auVar4,0);
      bVar18 = CARRY8(uVar13,uVar6);
      uVar13 = uVar13 + uVar6;
      uVar6 = (ulong)bVar18;
      bVar18 = CARRY8(uVar9,uVar7);
      uVar7 = uVar9 + uVar7;
      uVar9 = uVar7 + uVar6;
      uVar10 = uVar10 + (bVar18 || CARRY8(uVar7,uVar6));
      puVar8 = puVar8 + 1;
      bVar18 = uVar16 != 0;
      uVar16 = uVar16 - 1;
    } while (bVar18);
    result[uVar11] = uVar13;
    uVar11 = uVar11 + 1;
    uVar13 = uVar9;
  } while (uVar11 != 4);
  lVar12 = 1;
  lVar14 = 4;
  do {
    uVar11 = uVar10;
    lVar1 = lVar14 + 1;
    uVar10 = 0;
    lVar15 = lVar12;
    puVar17 = right + 3;
    do {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *puVar17;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = left[lVar15];
      uVar6 = SUB168(auVar3 * auVar5,8);
      uVar16 = SUB168(auVar3 * auVar5,0);
      bVar18 = CARRY8(uVar9,uVar16);
      uVar9 = uVar9 + uVar16;
      uVar16 = (ulong)bVar18;
      bVar18 = CARRY8(uVar11,uVar6);
      uVar6 = uVar11 + uVar6;
      uVar11 = uVar6 + uVar16;
      uVar10 = uVar10 + (bVar18 || CARRY8(uVar6,uVar16));
      lVar15 = lVar15 + 1;
      puVar17 = puVar17 + -1;
    } while (lVar15 != 4);
    result[lVar14] = uVar9;
    lVar12 = lVar12 + 1;
    uVar9 = uVar11;
    lVar14 = lVar1;
  } while (lVar1 != 7);
  result[7] = uVar11;
  return;
}

Assistant:

static void vli_mult(uECC_word_t *result, const uECC_word_t *left, const uECC_word_t *right) {
    uECC_word_t r0 = 0;
    uECC_word_t r1 = 0;
    uECC_word_t r2 = 0;
    wordcount_t i, k;

    /* Compute each digit of result in sequence, maintaining the carries. */
    for (k = 0; k < uECC_WORDS; ++k) {
        for (i = 0; i <= k; ++i) {
            muladd(left[i], right[k - i], &r0, &r1, &r2);
        }
        result[k] = r0;
        r0 = r1;
        r1 = r2;
        r2 = 0;
    }
    for (k = uECC_WORDS; k < uECC_WORDS * 2 - 1; ++k) {
        for (i = (k + 1) - uECC_WORDS; i < uECC_WORDS; ++i) {
            muladd(left[i], right[k - i], &r0, &r1, &r2);
        }
        result[k] = r0;
        r0 = r1;
        r1 = r2;
        r2 = 0;
    }
    result[uECC_WORDS * 2 - 1] = r0;
}